

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

int SBPL_PRINTALL(int level,char *format,...)

{
  char *__s;
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char buffer [1024];
  undefined8 local_4f8;
  void **local_4f0;
  undefined1 *local_4e8;
  undefined1 local_4d8 [16];
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  char acStack_429 [1025];
  
  if (in_AL != '\0') {
    local_4a8 = in_XMM0_Qa;
    local_498 = in_XMM1_Qa;
    local_488 = in_XMM2_Qa;
    local_478 = in_XMM3_Qa;
    local_468 = in_XMM4_Qa;
    local_458 = in_XMM5_Qa;
    local_448 = in_XMM6_Qa;
    local_438 = in_XMM7_Qa;
  }
  if (sbpl_print_fp == (SBPL_PRINT_TEXT_FP)0x0) {
    iVar1 = 0;
  }
  else {
    local_4e8 = local_4d8;
    local_4f0 = &args[0].overflow_arg_area;
    local_4f8 = 0x3000000010;
    __s = acStack_429 + 1;
    local_4c8 = in_RDX;
    local_4c0 = in_RCX;
    local_4b8 = in_R8;
    local_4b0 = in_R9;
    memset(__s,0,0x400);
    iVar1 = vsnprintf(__s,0x3ff,format,&local_4f8);
    if (iVar1 < 0) {
      printf("SBPL_PRINTALL::ERROR, could not complete call to vsnprintf()");
    }
    else {
      if (iVar1 == 0x400) {
        printf("SBPL_PRINTALL::ERROR, SBPL_PRINTF_BUFFER_SIZE: %d not large enough",0x400);
      }
      if (__s[(long)iVar1 + -1] == '\n') {
        acStack_429[iVar1] = '\0';
      }
      (*sbpl_print_fp)(level,acStack_429 + 1);
    }
  }
  return iVar1;
}

Assistant:

int SBPL_PRINTALL(int level, const char* format, ...)
{
	int retVal = 0;
    if (sbpl_print_fp) {
        // parse arguments and pass resultant string to configured logger
        va_list args;
        va_start(args, format);
    	char buffer[SBPL_PRINTF_BUFFER_SIZE] = {0};
        retVal = vsnprintf(buffer,SBPL_PRINTF_BUFFER_SIZE - 1, format, args);
        if (retVal < 0) {
            printf("SBPL_PRINTALL::ERROR, could not complete call to vsnprintf()");
        }
        else {
            if (retVal == SBPL_PRINTF_BUFFER_SIZE) {
                printf("SBPL_PRINTALL::ERROR, SBPL_PRINTF_BUFFER_SIZE: %d not large enough", SBPL_PRINTF_BUFFER_SIZE);
            }
            if(buffer[retVal-1] == '\n') { // Remove newline
                buffer[retVal-1] = '\0';
            }
            sbpl_print_fp(level, &buffer[0]);
        }
    	va_end(args);
    }
	return retVal;
}